

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O0

int contest(nn_quant *nnq,int al,int b,int g,int r)

{
  int iVar1;
  nq_pixel *paiVar2;
  int *n;
  int *f;
  int *p;
  double bestbiasd;
  double bestd;
  uint local_38;
  uint bestbiaspos;
  uint bestpos;
  int betafreq;
  int biasdist;
  int a;
  int dist;
  int i;
  int r_local;
  int g_local;
  int b_local;
  int al_local;
  nn_quant *nnq_local;
  
  bestbiasd = 2147483647.0;
  p = (int *)0x41dfffffffc00000;
  local_38 = 0;
  bestd._4_4_ = 0;
  n = nnq->freq;
  f = nnq->bias;
  for (a = 0; a < nnq->netsize; a = a + 1) {
    paiVar2 = nnq->network + a;
    biasdist = (*paiVar2)[0] - al;
    if (biasdist < 0) {
      biasdist = -biasdist;
    }
    betafreq = (*paiVar2)[1] - b;
    if (betafreq < 0) {
      betafreq = -betafreq;
    }
    iVar1 = betafreq + biasdist;
    betafreq = (*paiVar2)[2] - g;
    if (betafreq < 0) {
      betafreq = -betafreq;
    }
    iVar1 = betafreq + iVar1;
    betafreq = (*paiVar2)[3] - r;
    if (betafreq < 0) {
      betafreq = -betafreq;
    }
    iVar1 = betafreq + iVar1;
    if ((double)iVar1 < bestbiasd) {
      bestbiasd = (double)iVar1;
      local_38 = a;
    }
    iVar1 = iVar1 - (*f >> 0xc);
    if ((double)iVar1 < (double)p) {
      p = (int *)(double)iVar1;
      bestd._4_4_ = a;
    }
    iVar1 = *n;
    *n = *n - (iVar1 >> 10);
    *f = (iVar1 >> 10) * 0x400 + *f;
    n = n + 1;
    f = f + 1;
  }
  nnq->freq[local_38] = nnq->freq[local_38] + 0x40;
  nnq->bias[local_38] = nnq->bias[local_38] + -0x10000;
  return bestd._4_4_;
}

Assistant:

int contest(nnq, al,b,g,r)
nn_quant *nnq;
register int al,b,g,r;
{
	/* finds closest neuron (min dist) and updates freq */
	/* finds best neuron (min dist-bias) and returns position */
	/* for frequently chosen neurons, freq[i] is high and bias[i] is negative */
	/* bias[i] = gamma*((1/netsize)-freq[i]) */

	register int i,dist,a,biasdist,betafreq;
	unsigned int bestpos,bestbiaspos;
	double bestd,bestbiasd;
	register int *p,*f, *n;

	bestd = ~(((int) 1)<<31);
	bestbiasd = bestd;
	bestpos = 0;
	bestbiaspos = bestpos;
	p = nnq->bias;
	f = nnq->freq;

	for (i=0; i< nnq->netsize; i++) {
		n = nnq->network[i];
		dist = n[0] - al;
		if (dist<0) dist = -dist;
		a = n[1] - b;
		if (a<0) a = -a;
		dist += a;
		a = n[2] - g;
		if (a<0) a = -a;
		dist += a;
		a = n[3] - r;
		if (a<0) a = -a;
		dist += a;
		if (dist<bestd) {
			bestd=dist;
			bestpos=i;
		}
		biasdist = dist - ((*p)>>(intbiasshift-netbiasshift));
		if (biasdist<bestbiasd) {
			bestbiasd=biasdist;
			bestbiaspos=i;
		}
		betafreq = (*f >> betashift);
		*f++ -= betafreq;
		*p++ += (betafreq<<gammashift);
	}
	nnq->freq[bestpos] += beta;
	nnq->bias[bestpos] -= betagamma;
	return(bestbiaspos);
}